

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O3

uint32_t __thiscall
basist::bitwise_decoder::decode_huffman
          (bitwise_decoder *this,huffman_decoding_table *ct,int fast_lookup_bits)

{
  short sVar1;
  uint uVar2;
  char *__function;
  uint32_t uVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  
  if ((ct->m_code_sizes).m_size == 0) {
    __assert_fail("ct.m_code_sizes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                  ,0x1bf,
                  "uint32_t basist::bitwise_decoder::decode_huffman(const huffman_decoding_table &, int)"
                 );
  }
  uVar4 = this->m_bit_buf_size;
  if (uVar4 < 0x10) {
    uVar3 = this->m_bit_buf;
    pbVar5 = this->m_pBuf;
    uVar2 = uVar4;
    do {
      uVar4 = 0;
      pbVar6 = pbVar5;
      if (pbVar5 < this->m_pBuf_end) {
        pbVar6 = pbVar5 + 1;
        this->m_pBuf = pbVar6;
        uVar4 = (uint)*pbVar5;
      }
      uVar3 = uVar3 | uVar4 << ((byte)uVar2 & 0x1f);
      this->m_bit_buf = uVar3;
      uVar4 = uVar2 + 8;
      this->m_bit_buf_size = uVar4;
      bVar7 = uVar2 < 8;
      pbVar5 = pbVar6;
      uVar2 = uVar4;
    } while (bVar7);
  }
  else {
    uVar3 = this->m_bit_buf;
  }
  uVar2 = ~(-1 << ((byte)fast_lookup_bits & 0x1f)) & uVar3;
  if ((ct->m_lookup).m_size <= uVar2) {
    __function = "const T &basisu::vector<int>::operator[](size_t) const [T = int]";
LAB_0013abe0:
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x177,__function);
  }
  uVar2 = (ct->m_lookup).m_p[uVar2];
  if ((int)uVar2 < 0) {
    do {
      uVar2 = ~uVar2 + (uint)((uVar3 >> (fast_lookup_bits & 0x1fU) & 1) != 0);
      if ((ct->m_tree).m_size <= uVar2) {
        __function = "const T &basisu::vector<short>::operator[](size_t) const [T = short]";
        goto LAB_0013abe0;
      }
      fast_lookup_bits = fast_lookup_bits + 1;
      sVar1 = (ct->m_tree).m_p[uVar2];
      uVar2 = (uint)sVar1;
    } while (sVar1 < 0);
  }
  else {
    fast_lookup_bits = uVar2 >> 0x10;
    uVar2 = uVar2 & 0xffff;
  }
  this->m_bit_buf = uVar3 >> ((byte)fast_lookup_bits & 0x1f);
  this->m_bit_buf_size = uVar4 - fast_lookup_bits;
  return uVar2;
}

Assistant:

inline uint32_t decode_huffman(const huffman_decoding_table &ct, int fast_lookup_bits = basisu::cHuffmanFastLookupBits)
		{
			assert(ct.m_code_sizes.size());

			const uint32_t huffman_fast_lookup_size = 1 << fast_lookup_bits;
						
			while (m_bit_buf_size < 16)
			{
				uint32_t c = 0;
				if (m_pBuf < m_pBuf_end)
					c = *m_pBuf++;

				m_bit_buf |= (c << m_bit_buf_size);
				m_bit_buf_size += 8;
				assert(m_bit_buf_size <= 32);
			}
						
			int code_len;

			int sym;
			if ((sym = ct.m_lookup[m_bit_buf & (huffman_fast_lookup_size - 1)]) >= 0)
			{
				code_len = sym >> 16;
				sym &= 0xFFFF;
			}
			else
			{
				code_len = fast_lookup_bits;
				do
				{
					sym = ct.m_tree[~sym + ((m_bit_buf >> code_len++) & 1)]; // ~sym = -sym - 1
				} while (sym < 0);
			}

			m_bit_buf >>= code_len;
			m_bit_buf_size -= code_len;

			return sym;
		}